

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

uint32_t nni_msg_header_trim_u32(nni_msg *m)

{
  uint uVar1;
  size_t __n;
  
  uVar1 = m->m_header_buf[0];
  __n = m->m_header_len - 4;
  m->m_header_len = __n;
  memmove(m,m->m_header_buf + 1,__n);
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

uint32_t
nni_msg_header_trim_u32(nni_msg *m)
{
	uint32_t val;
	uint8_t *dst;
	dst = (void *) m->m_header_buf;
	NNI_GET32(dst, val);
	m->m_header_len -= sizeof(val);
	memmove(m->m_header_buf, &m->m_header_buf[1], m->m_header_len);
	return (val);
}